

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O0

Vec_Int_t * Acec_BuildTree(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Int_t *vRootLits)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLitNew;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vRootRanks;
  Vec_Int_t *vLevel;
  Vec_Wec_t *vLeafMap;
  Vec_Int_t *vRootLits_local;
  Vec_Wec_t *vLeafLits_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_WecSize(vLeafLits);
  p_00 = Vec_WecStart(iVar1);
  if (vRootLits != (Vec_Int_t *)0x0) {
    for (iLit = 0; iVar1 = Vec_IntSize(vRootLits), iLit < iVar1; iLit = iLit + 1) {
      iVar1 = Vec_IntEntry(vRootLits,iLit);
      iVar2 = Vec_WecSize(p_00);
      if (iLit < iVar2) {
        vRootRanks = Vec_WecEntry(p_00,iLit);
      }
      else {
        vRootRanks = Vec_WecPushLevel(p_00);
      }
      Vec_IntPush(vRootRanks,iVar1);
    }
  }
  for (iLit = 0; iVar1 = Vec_WecSize(vLeafLits), iLit < iVar1; iLit = iLit + 1) {
    pVVar3 = Vec_WecEntry(vLeafLits,iLit);
    for (iLitNew = 0; iVar1 = Vec_IntSize(pVVar3), iLitNew < iVar1; iLitNew = iLitNew + 1) {
      iVar1 = Vec_IntEntry(pVVar3,iLitNew);
      iVar2 = Abc_Lit2Var(iVar1);
      pObj_00 = Gia_ManObj(p,iVar2);
      iVar2 = Acec_InsertBox_rec(pNew,p,pObj_00);
      iVar1 = Abc_LitIsCompl(iVar1);
      iVar1 = Abc_LitNotCond(iVar2,iVar1);
      Vec_WecPush(p_00,iLit,iVar1);
    }
  }
  pVVar3 = Acec_InsertTree(pNew,p_00);
  Vec_WecFree(p_00);
  return pVVar3;
}

Assistant:

Vec_Int_t * Acec_BuildTree( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Int_t * vRootLits )
{
    Vec_Wec_t * vLeafMap = Vec_WecStart( Vec_WecSize(vLeafLits) );
    Vec_Int_t * vLevel, * vRootRanks;  
    int i, k, iLit, iLitNew;
    // add roo literals
    if ( vRootLits )
        Vec_IntForEachEntry( vRootLits, iLit, i )
        {
            if ( i < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, iLit );
        }
    // add other literals
    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = Acec_InsertBox_rec( pNew, p, pObj );
            iLitNew = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
            Vec_WecPush( vLeafMap, i, iLitNew );
        }
    // construct map of root literals
    vRootRanks = Acec_InsertTree( pNew, vLeafMap );
    Vec_WecFree( vLeafMap );
    return vRootRanks;
}